

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

char * __thiscall
cmCTestTestHandler::GetTestStatus(cmCTestTestHandler *this,cmCTestTestResult *result)

{
  int iVar1;
  int status;
  cmCTestTestResult *result_local;
  cmCTestTestHandler *this_local;
  
  iVar1 = result->Status;
  if ((iVar1 < 0) || (9 < iVar1)) {
    this_local = (cmCTestTestHandler *)anon_var_dwarf_10c845;
  }
  else if (iVar1 == 6) {
    this_local = (cmCTestTestHandler *)std::__cxx11::string::c_str();
  }
  else {
    this_local = (cmCTestTestHandler *)GetTestStatus::statuses[iVar1];
  }
  return (char *)this_local;
}

Assistant:

const char* cmCTestTestHandler::GetTestStatus(const cmCTestTestResult* result)
{
  static const char* statuses[] = { "Not Run",     "Timeout",   "SEGFAULT",
                                    "ILLEGAL",     "INTERRUPT", "NUMERICAL",
                                    "OTHER_FAULT", "Failed",    "BAD_COMMAND",
                                    "Completed" };
  int status = result->Status;
  if (status < cmCTestTestHandler::NOT_RUN ||
      status > cmCTestTestHandler::COMPLETED) {
    return "No Status";
  }
  if (status == cmCTestTestHandler::OTHER_FAULT) {
    return result->ExceptionStatus.c_str();
  }
  return statuses[status];
}